

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

int __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeIntoClearedMessages
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  LogMessage *pLVar7;
  ulong uVar8;
  ulong uVar9;
  string_view sVar10;
  LogMessage local_40;
  
  ppvVar3 = elements(this);
  iVar1 = this->current_size_;
  ppvVar4 = elements(from);
  uVar2 = ClearedCount(this);
  if (from->current_size_ < (int)uVar2) {
    uVar2 = from->current_size_;
  }
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  while( true ) {
    if (uVar8 == uVar9) {
      return uVar2;
    }
    if ((long *)ppvVar4[uVar9] == (long *)0x0) break;
    lVar5 = (**(code **)(*ppvVar4[uVar9] + 0x20))();
    lVar6 = (**(code **)(**ppvVar4 + 0x20))();
    if (lVar5 != lVar6) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                 ,0xb5,"TypeId::Get(*src[i]) == TypeId::Get(*src[0])");
      sVar10 = MessageLite::GetTypeName((MessageLite *)ppvVar4[uVar9]);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,sVar10);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,(char (*) [5])" vs ")
      ;
      sVar10 = MessageLite::GetTypeName((MessageLite *)*ppvVar4);
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,sVar10);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    MessageLite::CheckTypeAndMergeFrom
              ((MessageLite *)ppvVar3[(long)iVar1 + uVar9],(MessageLite *)ppvVar4[uVar9]);
    uVar9 = uVar9 + 1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
             ,0xb4,"src[i] != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

int RepeatedPtrFieldBase::MergeIntoClearedMessages(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  auto dst = reinterpret_cast<MessageLite**>(elements() + current_size_);
  auto src = reinterpret_cast<MessageLite* const*>(from.elements());
  int count = std::min(ClearedCount(), from.current_size_);
  for (int i = 0; i < count; ++i) {
    ABSL_DCHECK(src[i] != nullptr);
    ABSL_DCHECK(TypeId::Get(*src[i]) == TypeId::Get(*src[0]))
        << src[i]->GetTypeName() << " vs " << src[0]->GetTypeName();
    dst[i]->CheckTypeAndMergeFrom(*src[i]);
  }
  return count;
}